

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O3

bool isEntryInIanaList(QByteArrayView id,QByteArrayView ianaIds)

{
  int iVar1;
  void *pvVar2;
  size_t __n;
  char *b;
  storage_type *__s;
  size_t __n_00;
  size_t sVar3;
  size_t sVar4;
  bool bVar5;
  
  __n_00 = id.m_size;
  __s = ianaIds.m_data;
  __n = ianaIds.m_size;
  sVar3 = __n;
  if (0 < (long)__n) {
    do {
      pvVar2 = memchr(__s,0x20,__n);
      sVar3 = __n;
      if ((pvVar2 == (void *)0x0) || (sVar4 = (long)pvVar2 - (long)__s, (long)sVar4 < 0)) break;
      if (sVar4 == __n_00) {
        if (__n_00 == 0) {
          return true;
        }
        iVar1 = bcmp(id.m_data,__s,__n_00);
        if (iVar1 == 0) {
          return true;
        }
      }
      __s = __s + sVar4 + 1;
      sVar3 = __n - (sVar4 + 1);
      bVar5 = (long)(sVar4 + 1) <= (long)__n;
      __n = sVar3;
    } while (sVar3 != 0 && bVar5);
  }
  if (sVar3 == __n_00) {
    if (__n_00 == 0) {
      bVar5 = true;
    }
    else {
      iVar1 = bcmp(id.m_data,__s,__n_00);
      bVar5 = iVar1 == 0;
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

static bool isEntryInIanaList(QByteArrayView id, QByteArrayView ianaIds)
{
    qsizetype cut;
    while ((cut = ianaIds.indexOf(' ')) >= 0) {
        if (id == ianaIds.first(cut))
            return true;
        ianaIds = ianaIds.sliced(cut + 1);
    }
    return id == ianaIds;
}